

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O0

void __thiscall QIcon::addFile(QIcon *this,QString *fileName,QSize *size,Mode mode,State state)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  QVarLengthArray<int,_4LL> *this_00;
  iterator piVar5;
  qreal *targetDevicePixelRatio;
  qreal *sourceDevicePixelRatio_00;
  undefined4 in_ECX;
  undefined8 in_RDX;
  QString *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  int dpr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  add_const_t<QVarLengthArray<int,_4LL>_> *__range1_1;
  QScreen *screen;
  QList<QScreen_*> *__range1;
  QIconEngine *engine;
  bool alreadyAdded;
  QString atNxFileName;
  qreal sourceDevicePixelRatio;
  int dpr;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QScreen_*> screens;
  QString suffix;
  QFileInfo info;
  QVarLengthArray<int,_4LL> devicePixelRatios;
  QString *in_stack_fffffffffffffe68;
  QVarLengthArray<int,_4LL> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  QVLABase<int> *in_stack_fffffffffffffe80;
  QVLABase<int> *in_stack_fffffffffffffe88;
  QIcon *in_stack_fffffffffffffe90;
  QVarLengthArray<int,_4LL> *baseFileName;
  byte local_119;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  double local_e0;
  int local_d4;
  QScreen **local_d0;
  const_iterator local_c8;
  const_iterator local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  QLatin1StringView local_a0;
  undefined1 local_90 [24];
  QMimeDatabase local_78 [8];
  QMimeType local_70 [32];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QVarLengthArray<int,_4LL> local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x28d16d);
  if (!bVar1) {
    detach(in_stack_fffffffffffffe90);
    local_119 = 0;
    if (*in_RDI == 0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_38,in_RSI);
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::suffix();
      bVar1 = QString::isEmpty((QString *)0x28d209);
      if (bVar1) {
        QMimeDatabase::QMimeDatabase(local_78);
        QMimeDatabase::mimeTypeForFile(local_70,local_78,&local_38,0);
        QMimeType::preferredSuffix();
        QString::operator=((QString *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        QString::~QString((QString *)0x28d272);
        QMimeType::~QMimeType(local_70);
        QMimeDatabase::~QMimeDatabase(local_78);
      }
      in_stack_fffffffffffffe88 =
           (QVLABase<int> *)
           iconEngineFromSuffix
                     ((QString *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                      (QString *)in_stack_fffffffffffffe70);
      if (in_stack_fffffffffffffe88 != (QVLABase<int> *)0x0) {
        iVar3 = (*((_func_int **)(in_stack_fffffffffffffe88->super_QVLABaseBase).a)[0xd])();
        local_119 = ((byte)iVar3 ^ 0xff) & 1;
      }
      pvVar4 = operator_new(0x18);
      if (in_stack_fffffffffffffe88 == (QVLABase<int> *)0x0) {
        in_stack_fffffffffffffe80 = (QVLABase<int> *)operator_new(0x20);
        QPixmapIconEngine::QPixmapIconEngine((QPixmapIconEngine *)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe88 = in_stack_fffffffffffffe80;
      }
      QIconPrivate::QIconPrivate
                ((QIconPrivate *)in_stack_fffffffffffffe70,(QIconEngine *)in_stack_fffffffffffffe68)
      ;
      *in_RDI = (long)pvVar4;
      QString::~QString((QString *)0x28d32e);
      QFileInfo::~QFileInfo((QFileInfo *)&local_38);
    }
    if (local_119 == 0) {
      (**(code **)(**(long **)*in_RDI + 0x30))(*(long **)*in_RDI,in_RSI,in_RDX,in_ECX,in_R8D);
    }
    (**(code **)(**(long **)*in_RDI + 0x38))(local_90);
    local_a0 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                          (size_t)in_stack_fffffffffffffe70);
    bVar2 = ::operator==((QString *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                         (QLatin1StringView *)in_stack_fffffffffffffe70);
    QString::~QString((QString *)0x28d3d2);
    if ((bVar2 & 1) == 0) {
      memset(&local_30,0xaa,0x28);
      QVarLengthArray<int,_4LL>::QVarLengthArray(&local_30);
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::instance();
      QGuiApplication::screens();
      local_c0.i = (QScreen **)&DAT_aaaaaaaaaaaaaaaa;
      local_c0 = QList<QScreen_*>::begin((QList<QScreen_*> *)in_stack_fffffffffffffe70);
      local_c8.i = (QScreen **)&DAT_aaaaaaaaaaaaaaaa;
      local_c8 = QList<QScreen_*>::end((QList<QScreen_*> *)in_stack_fffffffffffffe70);
      while( true ) {
        local_d0 = local_c8.i;
        bVar1 = QList<QScreen_*>::const_iterator::operator!=(&local_c0,local_c8);
        if (!bVar1) break;
        QList<QScreen_*>::const_iterator::operator*(&local_c0);
        QScreen::devicePixelRatio((QScreen *)in_stack_fffffffffffffe80);
        local_d4 = qCeil<double>(1.32209644718582e-317);
        if ((0 < local_d4) &&
           (bVar1 = QVLABase<int>::contains<int>
                              (in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80), !bVar1))
        {
          QVarLengthArray<int,_4LL>::push_back
                    (in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
        }
        QList<QScreen_*>::const_iterator::operator++(&local_c0);
      }
      this_00 = (QVarLengthArray<int,_4LL> *)QVLABase<int>::begin((QVLABase<int> *)0x28d551);
      piVar5 = QVLABase<int>::end((QVLABase<int> *)this_00);
      std::sort<int*,std::greater<int>>(this_00,piVar5);
      local_e0 = std::numeric_limits<double>::max();
      baseFileName = &local_30;
      targetDevicePixelRatio = (qreal *)QVLABase<int>::begin((QVLABase<int> *)0x28d5a4);
      sourceDevicePixelRatio_00 = (qreal *)QVLABase<int>::end(&this_00->super_QVLABase<int>);
      for (; targetDevicePixelRatio != sourceDevicePixelRatio_00;
          targetDevicePixelRatio = (qreal *)((long)targetDevicePixelRatio + 4)) {
        if ((double)*(int *)targetDevicePixelRatio < local_e0) {
          local_f8 = &DAT_aaaaaaaaaaaaaaaa;
          local_f0 = &DAT_aaaaaaaaaaaaaaaa;
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          qt_findAtNxFile((QString *)baseFileName,(qreal)targetDevicePixelRatio,
                          sourceDevicePixelRatio_00);
          bVar1 = ::operator!=((QString *)this_00,in_stack_fffffffffffffe68);
          if (bVar1) {
            (**(code **)(**(long **)*in_RDI + 0x30))
                      (*(long **)*in_RDI,&local_f8,in_RDX,in_ECX,in_R8D);
          }
          QString::~QString((QString *)0x28d691);
        }
      }
      QList<QScreen_*>::~QList((QList<QScreen_*> *)0x28d6b1);
      QVarLengthArray<int,_4LL>::~QVarLengthArray(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIcon::addFile(const QString &fileName, const QSize &size, Mode mode, State state)
{
    if (fileName.isEmpty())
        return;
    detach();
    bool alreadyAdded = false;
    if (!d) {

        QFileInfo info(fileName);
        QString suffix = info.suffix();
#if QT_CONFIG(mimetype)
        if (suffix.isEmpty())
            suffix = QMimeDatabase().mimeTypeForFile(info).preferredSuffix(); // determination from contents
#endif // mimetype
        QIconEngine *engine = iconEngineFromSuffix(fileName, suffix);
        if (engine)
            alreadyAdded = !engine->isNull();
        d = new QIconPrivate(engine ? engine : new QPixmapIconEngine);
    }
    if (!alreadyAdded)
        d->engine->addFile(fileName, size, mode, state);

    if (d->engine->key() == "svg"_L1)   // not needed and also not supported
        return;

    // Check if a "@Nx" file exists and add it.
    QVarLengthArray<int, 4> devicePixelRatios;
    const auto screens = qApp->screens();
    for (const auto *screen : screens) {
        const auto dpr = qCeil(screen->devicePixelRatio()); // qt_findAtNxFile only supports integer values
        if (dpr >= 1 && !devicePixelRatios.contains(dpr))
            devicePixelRatios.push_back(dpr);
    }
    std::sort(devicePixelRatios.begin(), devicePixelRatios.end(), std::greater<int>());
    qreal sourceDevicePixelRatio = std::numeric_limits<qreal>::max();
    for (const auto dpr : std::as_const(devicePixelRatios)) {
        if (dpr >= sourceDevicePixelRatio)
            continue;
        const QString atNxFileName = qt_findAtNxFile(fileName, dpr, &sourceDevicePixelRatio);
        if (atNxFileName != fileName)
            d->engine->addFile(atNxFileName, size, mode, state);
    }
}